

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

int __thiscall BinGE<1,_0,_0>::checkSatisfied(BinGE<1,_0,_0> *this)

{
  char cVar1;
  bool bVar2;
  IntView<0> *this_00;
  int64_t iVar3;
  long in_RDI;
  Tchar *unaff_retaddr;
  BoolView *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  char o;
  
  o = (char)((uint)in_stack_fffffffffffffffc >> 0x18);
  cVar1 = Tchar::operator_cast_to_char((Tchar *)(in_RDI + 0x10));
  if (cVar1 == '\0') {
    bVar2 = BoolView::isFalse(in_stack_ffffffffffffffe0);
    if (bVar2) {
      Tchar::operator=(unaff_retaddr,o);
      iVar4 = 1;
    }
    else {
      this_00 = (IntView<0> *)IntView<1>::getMin((IntView<1> *)in_stack_ffffffffffffffe0);
      iVar3 = IntView<0>::getMax(this_00);
      if (iVar3 <= (long)this_00) {
        Tchar::operator=(unaff_retaddr,o);
      }
      iVar4 = 3;
    }
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}
		return 3;
	}